

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regfileparser.cpp
# Opt level: O0

bool ProcessRegFile(string *filename,regkeymaker *mk)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  long lVar4;
  RegistryValue local_128;
  undefined1 local_108 [8];
  string valuespec;
  undefined1 local_e0 [8];
  string continuedline;
  string valuename;
  RegistryPath local_80;
  undefined1 local_48 [8];
  string line;
  FILE *f;
  regkeymaker *mk_local;
  string *filename_local;
  
  pcVar3 = (char *)std::__cxx11::string::c_str();
  line.field_2._8_8_ = fopen(pcVar3,"r");
  if ((FILE *)line.field_2._8_8_ == (FILE *)0x0) {
    pcVar3 = (char *)std::__cxx11::string::c_str();
    perror(pcVar3);
    filename_local._7_1_ = false;
  }
  else {
    std::__cxx11::string::string((string *)local_48);
LAB_00131389:
    bVar1 = ReadLine((FILE *)line.field_2._8_8_,(string *)local_48);
    if (bVar1) {
      while( true ) {
        lVar4 = std::__cxx11::string::size();
        bVar1 = false;
        if (lVar4 != 0) {
          std::__cxx11::string::size();
          pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)local_48);
          iVar2 = isspace((int)*pcVar3);
          bVar1 = iVar2 != 0;
        }
        if (!bVar1) break;
        std::__cxx11::string::size();
        std::__cxx11::string::resize((ulong)local_48);
      }
      stripbom((string *)local_48);
      lVar4 = std::__cxx11::string::size();
      if ((lVar4 != 0) &&
         (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_48,"REGEDIT4"), !bVar1)) {
        pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)local_48);
        if (*pcVar3 == '[') {
          std::__cxx11::string::size();
          pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)local_48);
          if (*pcVar3 == ']') {
            std::__cxx11::string::size();
            std::__cxx11::string::substr((ulong)((long)&valuename.field_2 + 8),(ulong)local_48);
            RegistryPath::FromKeySpec(&local_80,(string *)((long)&valuename.field_2 + 8));
            (**mk->_vptr_regkeymaker)(mk,&local_80);
            RegistryPath::~RegistryPath(&local_80);
            std::__cxx11::string::~string((string *)(valuename.field_2._M_local_buf + 8));
            goto LAB_00131389;
          }
        }
        pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)local_48);
        if (*pcVar3 != ';') {
          std::__cxx11::string::find_first_not_of(local_48,0x160be6);
          std::__cxx11::string::erase((ulong)local_48,0);
          GetNameFromSetSpec((string *)((long)&continuedline.field_2 + 8),(string *)local_48,0);
          do {
            std::__cxx11::string::size();
            pcVar3 = (char *)std::__cxx11::string::at((ulong)local_48);
            bVar1 = true;
            if (*pcVar3 != '\\') {
              std::__cxx11::string::size();
              pcVar3 = (char *)std::__cxx11::string::at((ulong)local_48);
              bVar1 = *pcVar3 == ',';
            }
            if (!bVar1) break;
            std::__cxx11::string::size();
            pcVar3 = (char *)std::__cxx11::string::at((ulong)local_48);
            if (*pcVar3 == '\\') {
              std::__cxx11::string::size();
              std::__cxx11::string::resize((ulong)local_48);
              while( true ) {
                lVar4 = std::__cxx11::string::size();
                bVar1 = false;
                if (lVar4 != 0) {
                  std::__cxx11::string::size();
                  pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)local_48);
                  iVar2 = isspace((int)*pcVar3);
                  bVar1 = iVar2 != 0;
                }
                if (!bVar1) break;
                std::__cxx11::string::size();
                std::__cxx11::string::resize((ulong)local_48);
              }
            }
            std::__cxx11::string::string((string *)local_e0);
            bVar1 = ReadLine((FILE *)line.field_2._8_8_,(string *)local_e0);
            if (bVar1) {
              std::__cxx11::string::find_first_not_of(local_e0,0x160be6);
              std::__cxx11::string::erase((ulong)local_e0,0);
              while( true ) {
                lVar4 = std::__cxx11::string::size();
                bVar1 = false;
                if (lVar4 != 0) {
                  std::__cxx11::string::size();
                  pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)local_e0);
                  iVar2 = isspace((int)*pcVar3);
                  bVar1 = iVar2 != 0;
                }
                if (!bVar1) break;
                std::__cxx11::string::size();
                std::__cxx11::string::resize((ulong)local_e0);
              }
              std::__cxx11::string::operator+=((string *)local_48,(string *)local_e0);
              valuespec.field_2._12_4_ = 0;
            }
            else {
              valuespec.field_2._12_4_ = 7;
            }
            std::__cxx11::string::~string((string *)local_e0);
          } while (valuespec.field_2._12_4_ == 0);
          GetValueSpecFromSetSpec((string *)local_108,(string *)local_48,0);
          RegistryValue::FromValueSpec(&local_128,(string *)local_108);
          (*mk->_vptr_regkeymaker[1])
                    (mk,(undefined1 *)((long)&continuedline.field_2 + 8),&local_128);
          RegistryValue::~RegistryValue(&local_128);
          std::__cxx11::string::~string((string *)local_108);
          std::__cxx11::string::~string((string *)(continuedline.field_2._M_local_buf + 8));
        }
      }
      goto LAB_00131389;
    }
    fclose((FILE *)line.field_2._8_8_);
    filename_local._7_1_ = true;
    valuespec.field_2._12_4_ = 1;
    std::__cxx11::string::~string((string *)local_48);
  }
  return filename_local._7_1_;
}

Assistant:

bool ProcessRegFile(const std::string& filename, regkeymaker& mk)
{
    FILE *f= fopen(filename.c_str(), "r");
    if (f==NULL) {
        perror(filename.c_str());
        return false;
    }

    std::string line;

// note: not yet handling linecontinuations
// note: not yet handling utf-16LE encoded files
    while (ReadLine(f, line)) {
        // remove trailing whitespace
        while (line.size() && isspace(line[line.size()-1])) {
            line.resize(line.size()-1);
        }

        stripbom(line);

        if (line.size()==0)
            continue;
        else if (line=="REGEDIT4")
            continue;
        else if (line[0]=='[' && line[line.size()-1]==']') {
            mk.newkey(RegistryPath::FromKeySpec(line.substr(1, line.size()-2)));
        }
        else if (line[0]==';') {
            // skip comments.
        }
        else {
            // remove leading whitespace
            line.erase(0, line.find_first_not_of(" \t"));

            std::string valuename= GetNameFromSetSpec(line, 0);

            // note: not handling comments here: comment ending in ',' will confuse us.

            // handle line continuation
            while (line.at(line.size()-1)=='\\' || line.at(line.size()-1)==',' ) {
                // strip  backslash + whitespace
                if (line.at(line.size()-1)=='\\') {
                    line.resize(line.size()-1);
                    while (line.size() && isspace(line[line.size()-1])) {
                        line.resize(line.size()-1);
                    }
                }
                std::string continuedline;
                if (!ReadLine(f, continuedline))
                    break;
                // trim whitespace
                continuedline.erase(0, continuedline.find_first_not_of(" \t"));
                while (continuedline.size() && isspace(continuedline[continuedline.size()-1])) {
                    continuedline.resize(continuedline.size()-1);
                }

                line += continuedline;
            }
            std::string valuespec= GetValueSpecFromSetSpec(line, 0);

            //debug("valline: %hs  = %hs\n", valuename.c_str(), valuespec.c_str());

            mk.setval(valuename, RegistryValue::FromValueSpec(valuespec));
        }
    }

    fclose(f);
    return true;
}